

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  int iVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  __m256i a_14;
  __m256i a_15;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  __m256i b_14;
  __m256i b_15;
  undefined1 auVar14 [32];
  int iVar15;
  int iVar16;
  int iVar17;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m256i *palVar18;
  __m256i *palVar19;
  __m256i *palVar20;
  __m256i *palVar21;
  __m256i *palVar22;
  __m256i *b_16;
  __m256i *b_17;
  __m256i *b_18;
  __m256i *b_19;
  __m256i *palVar23;
  __m256i *palVar24;
  __m256i *palVar25;
  ulong uVar26;
  longlong lVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  char *pcVar31;
  longlong lVar32;
  __m256i *palVar33;
  __m256i *palVar34;
  __m256i *palVar35;
  char *__format;
  ulong uVar36;
  __m256i *palVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  long lVar41;
  ulong size;
  __m256i *palVar42;
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [16];
  undefined1 auVar54 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar55 [16];
  undefined1 auVar60 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar66 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined8 in_stack_fffffffffffffbe8;
  __m256i *palVar74;
  __m256i *palVar75;
  __m256i *local_3d8;
  __m256i *local_3d0;
  __m256i *local_3c8;
  __m256i *local_3c0;
  __m256i *local_3b0;
  long local_3a8;
  ulong local_3a0;
  ulong local_390;
  undefined1 local_368 [32];
  __m256i *local_348;
  long lStack_340;
  long lStack_330;
  longlong local_308;
  long local_2b8;
  long lStack_2b0;
  long lStack_2a0;
  undefined1 local_298 [32];
  undefined1 local_1f8 [32];
  long local_198;
  long lStack_190;
  long lStack_188;
  long lStack_180;
  long local_58;
  long lStack_50;
  long lStack_40;
  
  uVar36 = CONCAT44(0,gap);
  pcVar31 = profile->s1;
  ppVar7 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_64(profile,s2,s2Len,open,gap);
  iVar15 = parasail_result_is_saturated(result);
  if (iVar15 != 0) {
    return result;
  }
  iVar15 = result->end_query;
  iVar6 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_64(pcVar31,iVar15 + 1,ppVar7);
  if (profile_00 == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar31 = "profile";
  }
  else {
    pvVar8 = (profile_00->profile64).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar31 = "profile->profile64.score";
    }
    else {
      ppVar7 = profile_00->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar31 = "profile->matrix";
      }
      else {
        uVar29 = (ulong)(uint)profile_00->s1Len;
        if (profile_00->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar31 = "s2";
        }
        else if (iVar6 < 0) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar9 = (profile_00->profile64).matches;
            pvVar10 = (profile_00->profile64).similar;
            iVar17 = ppVar7->max;
            result_00 = parasail_result_new_stats();
            if (result_00 != (parasail_result_t *)0x0) {
              size = uVar29 + 3 >> 2;
              result_00->flag = result_00->flag | 0x4810804;
              local_3b0 = parasail_memalign___m256i(0x20,size);
              palVar18 = parasail_memalign___m256i(0x20,size);
              local_3d0 = parasail_memalign___m256i(0x20,size);
              palVar19 = parasail_memalign___m256i(0x20,size);
              local_3d8 = parasail_memalign___m256i(0x20,size);
              palVar20 = parasail_memalign___m256i(0x20,size);
              palVar21 = parasail_memalign___m256i(0x20,size);
              palVar22 = parasail_memalign___m256i(0x20,size);
              b_16 = parasail_memalign___m256i(0x20,size);
              b_17 = parasail_memalign___m256i(0x20,size);
              b_18 = parasail_memalign___m256i(0x20,size);
              b_19 = parasail_memalign___m256i(0x20,size);
              palVar23 = parasail_memalign___m256i(0x20,size);
              palVar24 = parasail_memalign___m256i(0x20,size);
              palVar25 = parasail_memalign___m256i(0x20,size);
              local_3c0 = parasail_memalign___m256i(0x20,size);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = local_3b0;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = palVar18;
              auVar65 = vpunpcklqdq_avx(auVar65,auVar67);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = local_3d0;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = palVar19;
              auVar67 = vpunpcklqdq_avx(auVar43,auVar48);
              auVar43 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar65;
              auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_3d8;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = palVar20;
              auVar65 = vpunpcklqdq_avx(auVar49,auVar54);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = palVar21;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = palVar22;
              auVar67 = vpunpcklqdq_avx(auVar55,auVar61);
              auVar49 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar65;
              auVar54 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_16;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_17;
              auVar65 = vpunpcklqdq_avx(auVar60,auVar62);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = b_18;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = b_19;
              auVar67 = vpunpcklqdq_avx(auVar63,auVar68);
              auVar55 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar65;
              auVar60 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = palVar23;
              auVar69._8_8_ = 0;
              auVar69._0_8_ = palVar24;
              auVar65 = vpunpcklqdq_avx(auVar64,auVar69);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = palVar25;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = local_3c0;
              auVar67 = vpunpcklqdq_avx(auVar70,auVar71);
              auVar65 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar65;
              auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
              auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
              auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
              auVar44._16_8_ = -(ulong)(auVar48._0_8_ == 0);
              auVar44._24_8_ = -(ulong)(auVar48._8_8_ == 0);
              auVar50._0_8_ = -(ulong)(auVar49._0_8_ == 0);
              auVar50._8_8_ = -(ulong)(auVar49._8_8_ == 0);
              auVar50._16_8_ = -(ulong)(auVar54._0_8_ == 0);
              auVar50._24_8_ = -(ulong)(auVar54._8_8_ == 0);
              auVar44 = vpackssdw_avx2(auVar44,auVar50);
              auVar50 = vpermq_avx2(auVar44,0xd8);
              auVar51._0_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar51._8_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar51._16_8_ = -(ulong)(auVar60._0_8_ == 0);
              auVar51._24_8_ = -(ulong)(auVar60._8_8_ == 0);
              auVar56._0_8_ = -(ulong)(auVar65._0_8_ == 0);
              auVar56._8_8_ = -(ulong)(auVar65._8_8_ == 0);
              auVar56._16_8_ = -(ulong)(auVar67._0_8_ == 0);
              auVar56._24_8_ = -(ulong)(auVar67._8_8_ == 0);
              auVar44 = vpackssdw_avx2(auVar51,auVar56);
              auVar44 = vpermq_avx2(auVar44,0xd8);
              auVar44 = vpackssdw_avx2(auVar50,auVar44);
              if ((((((((((((((((auVar44 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar44 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar44 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar44 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar44 >> 0x7f,0) == '\0') &&
                        (auVar44 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar44 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar44 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar44 >> 0xbf,0) == '\0') &&
                    (auVar44 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar44 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar44 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar44[0x1f]) {
                local_3a0 = 0;
                auVar45._4_4_ = 0;
                auVar45._0_4_ = open;
                auVar45._8_4_ = open;
                auVar45._12_4_ = 0;
                auVar45._16_4_ = open;
                auVar45._20_4_ = 0;
                auVar45._24_4_ = open;
                auVar45._28_4_ = 0;
                alVar2[1] = (longlong)palVar23;
                alVar2[0] = in_stack_fffffffffffffbe8;
                alVar2[2] = (longlong)palVar24;
                alVar2[3] = (longlong)palVar20;
                parasail_memset___m256i(local_3b0,alVar2,size);
                alVar3[1] = (longlong)palVar23;
                alVar3[0] = in_stack_fffffffffffffbe8;
                alVar3[2] = (longlong)palVar24;
                alVar3[3] = (longlong)palVar20;
                parasail_memset___m256i(local_3d0,alVar3,size);
                alVar4[1] = (longlong)palVar23;
                alVar4[0] = in_stack_fffffffffffffbe8;
                alVar4[2] = (longlong)palVar24;
                alVar4[3] = (longlong)palVar20;
                parasail_memset___m256i(local_3d8,alVar4,size);
                alVar5[1] = (longlong)palVar23;
                alVar5[0] = in_stack_fffffffffffffbe8;
                alVar5[2] = (longlong)palVar24;
                alVar5[3] = (longlong)palVar20;
                parasail_memset___m256i(palVar21,alVar5,size);
                c[1] = (longlong)palVar23;
                c[0] = in_stack_fffffffffffffbe8;
                c[2] = (longlong)palVar24;
                c[3] = (longlong)palVar20;
                parasail_memset___m256i(b_16,c,size);
                c_00[1] = (longlong)palVar23;
                c_00[0] = in_stack_fffffffffffffbe8;
                c_00[2] = (longlong)palVar24;
                c_00[3] = (longlong)palVar20;
                parasail_memset___m256i(b_17,c_00,size);
                c_01[1] = (longlong)palVar23;
                c_01[0] = in_stack_fffffffffffffbe8;
                c_01[2] = (longlong)palVar24;
                c_01[3] = (longlong)palVar20;
                parasail_memset___m256i(b_18,c_01,size);
                c_02[1] = (longlong)palVar23;
                c_02[0] = in_stack_fffffffffffffbe8;
                c_02[2] = (longlong)palVar24;
                c_02[3] = (longlong)palVar20;
                parasail_memset___m256i(b_19,c_02,size);
                uVar13 = (uint)size;
                uVar26 = (ulong)(uVar13 - 1);
                auVar59 = ZEXT1664((undefined1  [16])0x0);
                auVar53 = ZEXT1664((undefined1  [16])0x0);
                local_198 = 0;
                lStack_190 = 0;
                lStack_188 = 0;
                lStack_180 = 0;
                local_308 = 0;
                local_3a8 = -0x4000000000000000;
                for (local_390 = 0; palVar75 = palVar21, local_390 != iVar6 + 1U;
                    local_390 = local_390 + 1) {
                  auVar47 = auVar53._0_32_;
                  local_1f8 = auVar59._0_32_;
                  alVar2 = local_3b0[uVar26];
                  alVar3 = local_3d0[uVar26];
                  alVar4 = local_3d8[uVar26];
                  alVar5 = palVar75[uVar26];
                  auVar44 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                  auVar44 = vpalignr_avx2((undefined1  [32])alVar2,auVar44,8);
                  auVar50 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                  auVar50 = vpalignr_avx2((undefined1  [32])alVar3,auVar50,8);
                  auVar51 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar51 = vpalignr_avx2((undefined1  [32])alVar4,auVar51,8);
                  auVar56 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                  auVar56 = vpalignr_avx2((undefined1  [32])alVar5,auVar56,8);
                  lVar30 = (long)(int)(ppVar7->mapper[(byte)s2[local_390]] * uVar13) * 0x20;
                  iVar16 = (int)local_390 + -2;
                  local_3c8 = palVar18;
                  palVar34 = palVar20;
                  palVar37 = local_3c0;
                  palVar21 = palVar22;
                  palVar35 = palVar19;
                  if ((int)local_3a0 == iVar16) {
                    local_3c8 = palVar23;
                    palVar34 = palVar25;
                    palVar37 = palVar22;
                    palVar21 = local_3c0;
                    palVar35 = palVar24;
                  }
                  local_3c0 = palVar37;
                  auVar59 = ZEXT1664((undefined1  [16])0x0);
                  local_368 = ZEXT1632(ZEXT816(0));
                  auVar53 = ZEXT1664((undefined1  [16])0x0);
                  auVar11._8_8_ = 1;
                  auVar11._0_8_ = 1;
                  auVar11._16_8_ = 1;
                  auVar11._24_8_ = 1;
                  palVar37 = (__m256i *)(uVar26 * 0x20);
                  palVar22 = palVar23;
                  palVar23 = palVar24;
                  palVar42 = palVar20;
                  palVar74 = palVar25;
                  palVar33 = local_3d0;
                  for (lVar41 = 0; size << 5 != lVar41; lVar41 = lVar41 + 0x20) {
                    auVar12 = *(undefined1 (*) [32])((long)*b_16 + lVar41);
                    auVar14 = *(undefined1 (*) [32])((long)*b_17 + lVar41);
                    auVar57 = *(undefined1 (*) [32])((long)*b_18 + lVar41);
                    auVar58 = *(undefined1 (*) [32])((long)*b_19 + lVar41);
                    auVar44 = vpaddq_avx2(auVar44,*(undefined1 (*) [32])
                                                   ((long)pvVar8 + lVar41 + lVar30));
                    a[1] = (longlong)palVar22;
                    a[0] = in_stack_fffffffffffffbe8;
                    a[2] = (longlong)palVar23;
                    a[3] = (longlong)palVar42;
                    b[1] = (longlong)local_3d8;
                    b[0] = (longlong)palVar74;
                    b[2] = (longlong)palVar33;
                    b[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a,b);
                    a_00[1] = (longlong)palVar22;
                    a_00[0] = in_stack_fffffffffffffbe8;
                    a_00[2] = (longlong)palVar23;
                    a_00[3] = (longlong)palVar42;
                    b_00[1] = (longlong)local_3d8;
                    b_00[0] = (longlong)palVar74;
                    b_00[2] = (longlong)palVar33;
                    b_00[3] = (longlong)palVar21;
                    auVar46 = auVar44;
                    _mm256_max_epi64_rpl(palVar37,a_00,b_00);
                    a_01[1] = (longlong)palVar22;
                    a_01[0] = in_stack_fffffffffffffbe8;
                    a_01[2] = (longlong)palVar23;
                    a_01[3] = (longlong)palVar42;
                    b_01[1] = (longlong)local_3d8;
                    b_01[0] = (longlong)palVar74;
                    b_01[2] = (longlong)palVar33;
                    b_01[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a_01,b_01);
                    *(undefined1 (*) [32])((long)*local_3c8 + lVar41) = auVar46;
                    local_58 = auVar44._0_8_;
                    local_1f8._0_8_ = auVar46._0_8_;
                    auVar73._0_8_ = -(ulong)(local_1f8._0_8_ == local_58);
                    lStack_50 = auVar44._8_8_;
                    local_1f8._8_8_ = auVar46._8_8_;
                    auVar73._8_8_ = -(ulong)(local_1f8._8_8_ == lStack_50);
                    local_1f8._24_8_ = auVar46._24_8_;
                    local_1f8._16_8_ = auVar46._16_8_;
                    auVar73._16_8_ = -(ulong)(local_1f8._16_8_ == auVar44._16_8_);
                    lStack_40 = auVar44._24_8_;
                    auVar73._24_8_ = -(ulong)(local_1f8._24_8_ == lStack_40);
                    local_348 = auVar59._0_8_;
                    auVar72._0_8_ = -(ulong)((__m256i *)local_1f8._0_8_ == local_348);
                    lStack_340 = auVar59._8_8_;
                    auVar72._8_8_ = -(ulong)(local_1f8._8_8_ == lStack_340);
                    auVar72._16_8_ = -(ulong)(local_1f8._16_8_ == auVar59._16_8_);
                    lStack_330 = auVar59._24_8_;
                    auVar72._24_8_ = -(ulong)(local_1f8._24_8_ == lStack_330);
                    auVar44 = vblendvpd_avx(auVar14,local_368,auVar72);
                    auVar50 = vpaddq_avx2(auVar50,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar41 + lVar30));
                    auVar44 = vblendvpd_avx(auVar44,auVar50,auVar73);
                    auVar66._0_8_ = -(ulong)(local_1f8._0_8_ == 0);
                    auVar66._8_8_ = -(ulong)(local_1f8._8_8_ == 0);
                    auVar66._16_8_ = -(ulong)(local_1f8._16_8_ == 0);
                    auVar66._24_8_ = -(ulong)(local_1f8._24_8_ == 0);
                    auVar52 = vpandn_avx2(auVar66,auVar44);
                    *(undefined1 (*) [32])((long)*palVar35 + lVar41) = auVar52;
                    auVar44 = vblendvpd_avx(auVar57,auVar53._0_32_,auVar72);
                    auVar50 = vpaddq_avx2(auVar51,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar41 + lVar30));
                    auVar44 = vblendvpd_avx(auVar44,auVar50,auVar73);
                    auVar50 = vblendvpd_avx(auVar58,auVar11,auVar72);
                    auVar51 = vpcmpeqd_avx2(auVar58,auVar58);
                    auVar51 = vpsubq_avx2(auVar56,auVar51);
                    auVar51 = vblendvpd_avx(auVar50,auVar51,auVar73);
                    auVar56 = vpandn_avx2(auVar66,auVar44);
                    auVar66 = vpandn_avx2(auVar66,auVar51);
                    *(undefined1 (*) [32])((long)*palVar34 + lVar41) = auVar56;
                    *(undefined1 (*) [32])((long)*palVar21 + lVar41) = auVar66;
                    a_02[1] = (longlong)palVar22;
                    a_02[0] = in_stack_fffffffffffffbe8;
                    a_02[2] = (longlong)palVar23;
                    a_02[3] = (longlong)palVar42;
                    b_02[1] = (longlong)local_3d8;
                    b_02[0] = (longlong)palVar74;
                    b_02[2] = (longlong)palVar33;
                    b_02[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a_02,b_02);
                    a_03[1] = (longlong)palVar22;
                    a_03[0] = in_stack_fffffffffffffbe8;
                    a_03[2] = (longlong)palVar23;
                    a_03[3] = (longlong)palVar42;
                    b_03[1] = (longlong)local_3d8;
                    b_03[0] = (longlong)palVar74;
                    b_03[2] = (longlong)palVar33;
                    b_03[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a_03,b_03);
                    a_04[1] = (longlong)palVar22;
                    a_04[0] = in_stack_fffffffffffffbe8;
                    a_04[2] = (longlong)palVar23;
                    a_04[3] = (longlong)palVar42;
                    b_04[1] = (longlong)local_3d8;
                    b_04[0] = (longlong)palVar74;
                    b_04[2] = (longlong)palVar33;
                    b_04[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a_04,b_04);
                    a_05[1] = (longlong)palVar22;
                    a_05[0] = in_stack_fffffffffffffbe8;
                    a_05[2] = (longlong)palVar23;
                    a_05[3] = (longlong)palVar42;
                    b_05[1] = (longlong)local_3d8;
                    b_05[0] = (longlong)palVar74;
                    b_05[2] = (longlong)palVar33;
                    b_05[3] = (longlong)palVar21;
                    _mm256_max_epi64_rpl(palVar37,a_05,b_05);
                    auVar72 = vpsubq_avx2(auVar46,auVar45);
                    auVar46._8_4_ = gap;
                    auVar46._0_8_ = uVar36;
                    auVar46._12_4_ = 0;
                    auVar46._16_4_ = gap;
                    auVar46._20_4_ = 0;
                    auVar46._24_4_ = gap;
                    auVar46._28_4_ = 0;
                    auVar44 = vpsubq_avx2(auVar12,auVar46);
                    a_06[1] = (longlong)palVar22;
                    a_06[0] = in_stack_fffffffffffffbe8;
                    a_06[2] = (longlong)palVar23;
                    a_06[3] = (longlong)palVar42;
                    b_06[1] = (longlong)local_3d8;
                    b_06[0] = (longlong)palVar74;
                    b_06[2] = (longlong)palVar33;
                    b_06[3] = (longlong)palVar21;
                    auVar73 = auVar72;
                    palVar24 = palVar23;
                    palVar20 = palVar42;
                    palVar25 = palVar74;
                    _mm256_max_epi64_rpl(palVar37,a_06,b_06);
                    auVar46 = vpcmpgtq_avx2(auVar72,auVar44);
                    auVar44 = vblendvpd_avx(auVar14,auVar52,auVar46);
                    auVar51 = vblendvpd_avx(auVar57,auVar56,auVar46);
                    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                    auVar12 = vpsubq_avx2(auVar58,auVar50);
                    auVar66 = vpsubq_avx2(auVar66,auVar50);
                    auVar50 = vblendvpd_avx(auVar12,auVar66,auVar46);
                    *(undefined1 (*) [32])((long)*b_16 + lVar41) = auVar73;
                    *(undefined1 (*) [32])((long)*b_17 + lVar41) = auVar44;
                    *(undefined1 (*) [32])((long)*b_18 + lVar41) = auVar51;
                    *(undefined1 (*) [32])((long)*b_19 + lVar41) = auVar50;
                    auVar12._8_4_ = gap;
                    auVar12._0_8_ = uVar36;
                    auVar12._12_4_ = 0;
                    auVar12._16_4_ = gap;
                    auVar12._20_4_ = 0;
                    auVar12._24_4_ = gap;
                    auVar12._28_4_ = 0;
                    auVar44 = vpsubq_avx2(auVar59._0_32_,auVar12);
                    a_07[1] = (longlong)palVar22;
                    a_07[0] = in_stack_fffffffffffffbe8;
                    a_07[2] = (longlong)palVar24;
                    a_07[3] = (longlong)palVar20;
                    b_07[1] = (longlong)local_3d8;
                    b_07[0] = (longlong)palVar25;
                    b_07[2] = (longlong)palVar33;
                    b_07[3] = (longlong)palVar21;
                    auVar50 = auVar72;
                    palVar23 = palVar24;
                    palVar42 = palVar20;
                    palVar74 = palVar25;
                    _mm256_max_epi64_rpl(palVar37,a_07,b_07);
                    auVar59 = ZEXT3264(auVar50);
                    auVar50 = vpcmpgtq_avx2(auVar72,auVar44);
                    local_368 = vblendvpd_avx(local_368,auVar52,auVar50);
                    auVar44 = vblendvpd_avx(auVar53._0_32_,auVar56,auVar50);
                    auVar53 = ZEXT3264(auVar44);
                    auVar44 = vpsubq_avx2(auVar11,_DAT_008a5a80);
                    auVar11 = vblendvpd_avx(auVar44,auVar66,auVar50);
                    auVar44 = *(undefined1 (*) [32])((long)*local_3b0 + lVar41);
                    auVar50 = *(undefined1 (*) [32])((long)*palVar33 + lVar41);
                    auVar51 = *(undefined1 (*) [32])((long)*local_3d8 + lVar41);
                    auVar56 = *(undefined1 (*) [32])((long)*palVar75 + lVar41);
                  }
                  palVar23 = palVar22;
                  if ((int)local_3a0 == iVar16) {
                    palVar23 = palVar18;
                    palVar24 = palVar19;
                    palVar25 = palVar20;
                  }
                  palVar20 = local_3d8;
                  palVar19 = palVar33;
                  for (iVar16 = 0; iVar16 != 4; iVar16 = iVar16 + 1) {
                    alVar2 = local_3b0[uVar26];
                    auVar44 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                    auVar44 = vpalignr_avx2((undefined1  [32])alVar2,auVar44,8);
                    auVar50 = vpermq_avx2(auVar59._0_32_,0x90);
                    auVar51 = vpblendd_avx2(auVar50,ZEXT832((ulong)(long)-open),3);
                    auVar50 = vperm2i128_avx2(local_368,local_368,8);
                    local_368 = vpalignr_avx2(local_368,auVar50,8);
                    auVar56 = auVar53._0_32_;
                    auVar50 = vperm2i128_avx2(auVar56,auVar56,8);
                    auVar50 = vpalignr_avx2(auVar56,auVar50,8);
                    auVar56 = vpermq_avx2(auVar11,0x90);
                    auVar11 = vpblendd_avx2(auVar56,ZEXT832(1),3);
                    lVar41 = 0;
                    while( true ) {
                      auVar59 = ZEXT3264(auVar51);
                      auVar53 = ZEXT3264(auVar50);
                      if (size << 5 == lVar41) break;
                      auVar44 = vpaddq_avx2(auVar44,*(undefined1 (*) [32])
                                                     ((long)pvVar8 + lVar41 + lVar30));
                      a_08[1] = (longlong)palVar22;
                      a_08[0] = in_stack_fffffffffffffbe8;
                      a_08[2] = (longlong)palVar24;
                      a_08[3] = (longlong)palVar42;
                      b_08[1] = (longlong)palVar20;
                      b_08[0] = (longlong)palVar25;
                      b_08[2] = (longlong)palVar19;
                      b_08[3] = (longlong)palVar21;
                      _mm256_max_epi64_rpl(palVar37,a_08,b_08);
                      plVar1 = (long *)((long)*local_3c8 + lVar41);
                      local_1f8._0_8_ = *plVar1;
                      local_1f8._8_8_ = plVar1[1];
                      local_1f8._16_8_ = plVar1[2];
                      local_1f8._24_8_ = plVar1[3];
                      a_09[1] = (longlong)palVar22;
                      a_09[0] = in_stack_fffffffffffffbe8;
                      a_09[2] = (longlong)palVar24;
                      a_09[3] = (longlong)palVar42;
                      b_09[1] = (longlong)palVar20;
                      b_09[0] = (longlong)palVar25;
                      b_09[2] = (longlong)palVar19;
                      b_09[3] = (longlong)palVar21;
                      _mm256_max_epi64_rpl(palVar37,a_09,b_09);
                      local_298._8_8_ = local_1f8._8_8_;
                      local_298._0_8_ = local_1f8._0_8_;
                      local_298._16_8_ = local_1f8._16_8_;
                      local_298._24_8_ = local_1f8._24_8_;
                      plVar1 = (long *)((long)*local_3c8 + lVar41);
                      *plVar1 = local_1f8._0_8_;
                      plVar1[1] = local_1f8._8_8_;
                      plVar1[2] = local_1f8._16_8_;
                      plVar1[3] = local_1f8._24_8_;
                      local_348 = auVar51._0_8_;
                      auVar57._0_8_ = -(ulong)((__m256i *)local_1f8._0_8_ == local_348);
                      lStack_340 = auVar51._8_8_;
                      auVar57._8_8_ = -(ulong)(local_1f8._8_8_ == lStack_340);
                      auVar57._16_8_ = -(ulong)(local_1f8._16_8_ == auVar51._16_8_);
                      lStack_330 = auVar51._24_8_;
                      auVar57._24_8_ = -(ulong)(local_1f8._24_8_ == lStack_330);
                      local_2b8 = auVar44._0_8_;
                      auVar52._0_8_ = -(ulong)(local_1f8._0_8_ == local_2b8);
                      lStack_2b0 = auVar44._8_8_;
                      auVar52._8_8_ = -(ulong)(local_1f8._8_8_ == lStack_2b0);
                      auVar52._16_8_ = -(ulong)(local_1f8._16_8_ == auVar44._16_8_);
                      lStack_2a0 = auVar44._24_8_;
                      auVar52._24_8_ = -(ulong)(local_1f8._24_8_ == lStack_2a0);
                      auVar52 = vpandn_avx2(auVar52,auVar57);
                      auVar44 = vblendvpd_avx(*(undefined1 (*) [32])((long)*palVar35 + lVar41),
                                              local_368,auVar52);
                      *(undefined1 (*) [32])((long)*palVar35 + lVar41) = auVar44;
                      auVar56 = vblendvpd_avx(*(undefined1 (*) [32])((long)*palVar34 + lVar41),
                                              auVar50,auVar52);
                      *(undefined1 (*) [32])((long)*palVar34 + lVar41) = auVar56;
                      auVar52 = vblendvpd_avx(*(undefined1 (*) [32])((long)*palVar21 + lVar41),
                                              auVar11,auVar52);
                      *(undefined1 (*) [32])((long)*palVar21 + lVar41) = auVar52;
                      a_10[1] = (longlong)palVar22;
                      a_10[0] = in_stack_fffffffffffffbe8;
                      a_10[2] = (longlong)palVar24;
                      a_10[3] = (longlong)palVar42;
                      b_10[1] = (longlong)palVar20;
                      b_10[0] = (longlong)palVar25;
                      b_10[2] = (longlong)palVar19;
                      b_10[3] = (longlong)palVar21;
                      _mm256_max_epi64_rpl(palVar37,a_10,b_10);
                      a_11[1] = (longlong)palVar22;
                      a_11[0] = in_stack_fffffffffffffbe8;
                      a_11[2] = (longlong)palVar24;
                      a_11[3] = (longlong)palVar42;
                      b_11[1] = (longlong)palVar20;
                      b_11[0] = (longlong)palVar25;
                      b_11[2] = (longlong)palVar19;
                      b_11[3] = (longlong)palVar21;
                      _mm256_max_epi64_rpl(palVar37,a_11,b_11);
                      a_12[1] = (longlong)palVar22;
                      a_12[0] = in_stack_fffffffffffffbe8;
                      a_12[2] = (longlong)palVar24;
                      a_12[3] = (longlong)palVar42;
                      b_12[1] = (longlong)palVar20;
                      b_12[0] = (longlong)palVar25;
                      b_12[2] = (longlong)palVar19;
                      b_12[3] = (longlong)palVar21;
                      _mm256_max_epi64_rpl(palVar37,a_12,b_12);
                      a_13[1] = (longlong)palVar22;
                      a_13[0] = in_stack_fffffffffffffbe8;
                      a_13[2] = (longlong)palVar24;
                      a_13[3] = (longlong)palVar42;
                      b_13[1] = (longlong)palVar20;
                      b_13[0] = (longlong)palVar25;
                      b_13[2] = (longlong)palVar19;
                      b_13[3] = (longlong)palVar21;
                      palVar33 = palVar19;
                      _mm256_max_epi64_rpl(palVar37,a_13,b_13);
                      auVar72 = vpsubq_avx2(local_298,auVar45);
                      auVar14._8_4_ = gap;
                      auVar14._0_8_ = uVar36;
                      auVar14._12_4_ = 0;
                      auVar14._16_4_ = gap;
                      auVar14._20_4_ = 0;
                      auVar14._24_4_ = gap;
                      auVar14._28_4_ = 0;
                      auVar51 = vpsubq_avx2(auVar51,auVar14);
                      auVar46 = vpcmpgtq_avx2(auVar51,auVar72);
                      auVar58._0_8_ = -(ulong)(auVar51._0_8_ == auVar72._0_8_);
                      auVar58._8_8_ = -(ulong)(auVar51._8_8_ == auVar72._8_8_);
                      auVar58._16_8_ = -(ulong)(auVar51._16_8_ == auVar72._16_8_);
                      auVar58._24_8_ = -(ulong)(auVar51._24_8_ == auVar72._24_8_);
                      auVar66 = vpcmpgtq_avx2(auVar51,_DAT_008a5840);
                      auVar66 = vpand_avx2(auVar58,auVar66);
                      auVar66 = vpor_avx2(auVar66,auVar46);
                      palVar19 = palVar33;
                      if ((((auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar66 >> 0x7f,0) == '\0') && SUB321(auVar66 >> 0xbf,0) == '\0')
                          && -1 < auVar66[0x1f]) goto LAB_00740334;
                      auVar66 = vpcmpgtq_avx2(auVar72,auVar51);
                      local_368 = vblendvpd_avx(local_368,auVar44,auVar66);
                      auVar50 = vblendvpd_avx(auVar50,auVar56,auVar66);
                      auVar44 = vblendvpd_avx(auVar11,auVar52,auVar66);
                      auVar11 = vpsubq_avx2(auVar44,_DAT_008a5a80);
                      auVar44 = *(undefined1 (*) [32])((long)*local_3b0 + lVar41);
                      lVar41 = lVar41 + 0x20;
                    }
                  }
LAB_00740334:
                  auVar44 = vpcmpgtq_avx2(local_1f8,auVar47);
                  local_3d0 = palVar35;
                  palVar18 = local_3b0;
                  palVar22 = palVar75;
                  local_3d8 = palVar34;
                  if ((((auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar44 >> 0x7f,0) != '\0') || SUB321(auVar44 >> 0xbf,0) != '\0') ||
                      auVar44[0x1f] < '\0') {
                    vpermq_avx2(local_1f8,0x44);
                    a_14[1] = (longlong)palVar23;
                    a_14[0] = in_stack_fffffffffffffbe8;
                    a_14[2] = (longlong)palVar24;
                    a_14[3] = (longlong)palVar42;
                    b_14[1] = (longlong)palVar20;
                    b_14[0] = (longlong)palVar25;
                    b_14[2] = (longlong)palVar19;
                    b_14[3] = (longlong)palVar21;
                    auVar44 = local_1f8;
                    palVar75 = palVar20;
                    _mm256_max_epi64_rpl(palVar37,a_14,b_14);
                    vpslldq_avx2(auVar44,8);
                    a_15[1] = (longlong)palVar23;
                    a_15[0] = in_stack_fffffffffffffbe8;
                    a_15[2] = (longlong)palVar24;
                    a_15[3] = (longlong)palVar42;
                    b_15[1] = (longlong)palVar75;
                    b_15[0] = (longlong)palVar25;
                    b_15[2] = (longlong)palVar19;
                    b_15[3] = (longlong)palVar21;
                    palVar33 = palVar19;
                    _mm256_max_epi64_rpl(palVar37,a_15,b_15);
                    local_3a8 = vpextrq_avx(auVar44._16_16_,1);
                    if ((long)(~(long)iVar17 + 0x7fffffffffffffffU) < local_3a8) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      palVar19 = palVar33;
                      palVar75 = palVar21;
                      goto LAB_00740496;
                    }
                    auVar47 = vpermq_avx2(auVar44,0xff);
                    local_3a0 = local_390 & 0xffffffff;
                  }
                  auVar59 = ZEXT3264(local_1f8);
                  auVar53 = ZEXT3264(auVar47);
                  palVar19 = palVar33;
                  local_3b0 = local_3c8;
                }
                local_390 = (ulong)(iVar6 + 1U);
                local_3c8 = local_3b0;
LAB_00740496:
                if ((local_3a8 == 0x7fffffffffffffff) ||
                   (auVar47._0_8_ = -(ulong)(local_198 == 0x7fffffffffffffff),
                   auVar47._8_8_ = -(ulong)(lStack_190 == 0x7fffffffffffffff),
                   auVar47._16_8_ = -(ulong)(lStack_188 == 0x7fffffffffffffff),
                   auVar47._24_8_ = -(ulong)(lStack_180 == 0x7fffffffffffffff),
                   (((auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    SUB321(auVar47 >> 0x7f,0) != '\0') || SUB321(auVar47 >> 0xbf,0) != '\0') ||
                   lStack_180 == 0x7fffffffffffffff)) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar17 = parasail_result_is_saturated(result_00);
                iVar16 = 0;
                palVar34 = palVar20;
                palVar35 = palVar18;
                palVar37 = local_3c0;
                palVar21 = palVar24;
                local_368._0_8_ = palVar25;
                palVar42 = palVar23;
                local_348 = palVar19;
                if (iVar17 == 0) {
                  if ((int)local_3a0 == (int)local_390 + -1) {
                    local_368._0_8_ = local_3d8;
                    palVar37 = palVar75;
                    palVar21 = local_3d0;
                    palVar42 = local_3c8;
                    palVar75 = local_3c0;
                    local_3d8 = palVar25;
                    local_3d0 = palVar24;
                    local_3c8 = palVar23;
                  }
                  else if ((int)local_3a0 == (int)local_390 + -2) {
                    palVar34 = palVar25;
                    palVar35 = palVar23;
                    palVar37 = palVar22;
                    palVar21 = palVar19;
                    palVar22 = local_3c0;
                    palVar42 = palVar18;
                    local_368._0_8_ = palVar20;
                    local_348 = palVar24;
                  }
                  uVar36 = 0;
                  lVar32 = 0;
                  lVar27 = 0;
                  while( true ) {
                    iVar17 = (int)lVar27;
                    iVar28 = (int)lVar32;
                    iVar40 = (int)uVar29;
                    if ((uVar13 & 0x1fffffff) << 2 == (uint)uVar36) break;
                    if (((*palVar42)[uVar36] == local_3a8) &&
                       (uVar39 = ((uint)uVar36 & 3) * uVar13 + ((uint)(uVar36 >> 2) & 0x3fffffff),
                       (int)uVar39 < iVar40)) {
                      lVar32 = (*palVar21)[uVar36];
                      local_308 = ((longlong *)local_368._0_8_)[uVar36];
                      lVar27 = (*palVar37)[uVar36];
                      uVar29 = (ulong)uVar39;
                    }
                    uVar36 = uVar36 + 1;
                  }
                  iVar16 = (int)local_308;
                  iVar38 = (int)local_3a8;
                }
                else {
                  iVar17 = 0;
                  iVar28 = 0;
                  iVar38 = 0;
                  local_3a0._0_4_ = 0;
                  iVar40 = 0;
                }
                result_00->score = iVar38;
                result_00->end_query = iVar40;
                result_00->end_ref = (int)local_3a0;
                ((result_00->field_4).stats)->matches = iVar28;
                ((result_00->field_4).stats)->similar = iVar16;
                ((result_00->field_4).stats)->length = iVar17;
                parasail_free(palVar37);
                parasail_free((void *)local_368._0_8_);
                parasail_free(palVar21);
                parasail_free(palVar42);
                parasail_free(b_19);
                parasail_free(b_18);
                parasail_free(b_17);
                parasail_free(b_16);
                parasail_free(palVar22);
                parasail_free(palVar75);
                parasail_free(palVar34);
                parasail_free(local_3d8);
                parasail_free(local_348);
                parasail_free(local_3d0);
                parasail_free(palVar35);
                parasail_free(local_3c8);
                goto LAB_00740818;
              }
            }
            result_00 = (parasail_result_t *)0x0;
            goto LAB_00740818;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "gap";
        }
      }
    }
  }
  result_00 = (parasail_result_t *)0x0;
  fprintf(_stderr,__format,"parasail_sw_stats_striped_profile_avx2_256_64_internal",pcVar31);
LAB_00740818:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  result_00->end_query = iVar15;
  result_00->end_ref = iVar6;
  return result_00;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}